

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O3

bool __thiscall
cmStandardLevelResolver::HaveStandardAvailable
          (cmStandardLevelResolver *this,cmGeneratorTarget *target,string *lang,string *config,
          string *feature)

{
  cmMakefile *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  iterator iVar4;
  cmValue cVar5;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  cmValue cVar7;
  StandardNeeded SVar8;
  string *psVar9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string e;
  string local_d0;
  cmMakefile *local_b0;
  string *local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  iVar4 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
          ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>_>_>
                  *)lang,(key_type *)target);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
      ._M_cur != (__node_type *)0x0) {
    this_00 = this->Makefile;
    local_88 = *(undefined8 *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                       ._M_cur + 0x28);
    local_90 = *(undefined8 *)
                ((long)iVar4.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                       ._M_cur + 0x30);
    local_a0._M_len = 6;
    local_a0._M_str = "CMAKE_";
    local_80 = 0x11;
    local_78 = "_STANDARD_DEFAULT";
    views._M_len = 3;
    views._M_array = &local_a0;
    local_a8 = feature;
    cmCatViews_abi_cxx11_(&local_d0,views);
    local_b0 = this_00;
    cVar5 = cmMakefile::GetDefinition(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (cVar5.Value == (string *)0x0) {
      local_88 = *(undefined8 *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                         ._M_cur + 0x28);
      local_90 = *(undefined8 *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                         ._M_cur + 0x30);
      local_a0._M_len = 6;
      local_a0._M_str = "CMAKE_";
      local_80 = 0x5f;
      local_78 = 
      "_STANDARD_DEFAULT is not set.  COMPILE_FEATURES support not fully configured for this compiler."
      ;
      views_00._M_len = 3;
      views_00._M_array = &local_a0;
      cmCatViews_abi_cxx11_(&local_d0,views_00);
      cmMakefile::IssueMessage(local_b0,INTERNAL_ERROR,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
    uVar1 = *(undefined8 *)
             ((long)iVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                    ._M_cur + 0x48);
    uVar2 = *(undefined8 *)
             ((long)iVar4.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                    ._M_cur + 0x50);
    iVar3 = anon_unknown.dwarf_3e7874::ParseStd((string *)((cVar5.Value)->_M_dataplus)._M_p);
    local_a0._M_len._0_4_ = iVar3;
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (uVar1,uVar2);
    if (_Var6._M_current ==
        *(int **)((long)iVar4.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                        ._M_cur + 0x50)) {
      local_88 = *(undefined8 *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                         ._M_cur + 0x28);
      local_90 = *(undefined8 *)
                  ((long)iVar4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                         ._M_cur + 0x30);
      local_a0._M_len = 10;
      local_a0._M_str = "The CMAKE_";
      local_80 = 0x37;
      local_78 = "_STANDARD_DEFAULT variable contains an invalid value: \"";
      local_68 = ((cVar5.Value)->_M_dataplus)._M_p;
      local_70 = (cVar5.Value)->_M_string_length;
      local_60 = 2;
      local_58 = "\".";
      views_01._M_len = 5;
      views_01._M_array = &local_a0;
      cmCatViews_abi_cxx11_(&local_d0,views_01);
      cmMakefile::IssueMessage(local_b0,INTERNAL_ERROR,&local_d0);
    }
    else {
      cVar7 = cmGeneratorTarget::GetLanguageStandard
                        (target,(string *)
                                ((long)iVar4.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                       ._M_cur + 0x28),config);
      if (cVar7.Value != (string *)0x0) {
        cVar5 = cVar7;
      }
      uVar1 = *(undefined8 *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x48);
      uVar2 = *(undefined8 *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x50);
      iVar3 = anon_unknown.dwarf_3e7874::ParseStd((string *)((cVar5.Value)->_M_dataplus)._M_p);
      local_a0._M_len = CONCAT44(local_a0._M_len._4_4_,iVar3);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (uVar1,uVar2);
      if (_Var6._M_current !=
          *(int **)((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                          ._M_cur + 0x50)) {
        SVar8 = anon_unknown.dwarf_3e7874::StandardLevelComputer::HighestStandardNeeded
                          ((StandardLevelComputer *)
                           ((long)iVar4.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                  ._M_cur + 0x28),local_b0,local_a8);
        if (SVar8.index == -1) {
          return true;
        }
        return (int *)((long)SVar8.index * 4 +
                      *(long *)((long)iVar4.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                                      ._M_cur + 0x48)) <= _Var6._M_current;
      }
      uVar1 = *(undefined8 *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x28);
      uVar2 = *(undefined8 *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::StandardLevelComputer>,_true>
                      ._M_cur + 0x30);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      local_a0._M_len = 4;
      local_a0._M_str = "The ";
      local_80 = 0x1e;
      local_78 = "_STANDARD property on target \"";
      local_68 = (psVar9->_M_dataplus)._M_p;
      local_70 = psVar9->_M_string_length;
      local_60 = 0x1f;
      local_58 = "\" contained an invalid value: \"";
      local_48 = ((cVar5.Value)->_M_dataplus)._M_p;
      local_50 = (cVar5.Value)->_M_string_length;
      local_40 = 2;
      local_38 = "\".";
      views_02._M_len = 7;
      views_02._M_array = &local_a0;
      local_90 = uVar2;
      local_88 = uVar1;
      cmCatViews_abi_cxx11_(&local_d0,views_02);
      cmMakefile::IssueMessage(local_b0,FATAL_ERROR,&local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool cmStandardLevelResolver::HaveStandardAvailable(
  cmGeneratorTarget const* target, std::string const& lang,
  std::string const& config, const std::string& feature) const
{
  auto mapping = StandardComputerMapping.find(lang);
  if (mapping != cm::cend(StandardComputerMapping)) {
    return mapping->second.HaveStandardAvailable(this->Makefile, target,
                                                 config, feature);
  }
  return false;
}